

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall kj::Maybe<float>::Maybe<double>(Maybe<float> *this,Maybe<double> *other)

{
  Maybe<double> *maybe;
  NullableValue<double> *other_00;
  double *pdVar1;
  double *val;
  undefined1 local_28 [8];
  NullableValue<double> _val1451;
  Maybe<double> *other_local;
  Maybe<float> *this_local;
  
  _val1451.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)other;
  kj::_::NullableValue<float>::NullableValue(&this->ptr);
  maybe = mv<kj::Maybe<double>>((Maybe<double> *)_val1451.field_1);
  other_00 = kj::_::readMaybe<double>(maybe);
  kj::_::NullableValue<double>::NullableValue((NullableValue<double> *)local_28,other_00);
  pdVar1 = kj::_::NullableValue::operator_cast_to_double_((NullableValue *)local_28);
  if (pdVar1 != (double *)0x0) {
    pdVar1 = kj::_::NullableValue<double>::operator*((NullableValue<double> *)local_28);
    pdVar1 = mv<double>(pdVar1);
    kj::_::NullableValue<float>::emplace<double>(&this->ptr,pdVar1);
    kj::Maybe<double>::operator=((Maybe<double> *)_val1451.field_1.value);
  }
  kj::_::NullableValue<double>::~NullableValue((NullableValue<double> *)local_28);
  return;
}

Assistant:

Maybe(Maybe<U>&& other) {
    KJ_IF_SOME(val, kj::mv(other)) {
      ptr.emplace(kj::mv(val));
      other = kj::none;
    }
  }